

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

BSDF * createLambertian(SurfaceInteraction *si,Allocator alloc)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BxDFHandle local_38;
  undefined4 *puVar3;
  
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x28,4);
  puVar3 = (undefined4 *)CONCAT44(extraout_var,iVar2);
  *puVar3 = 0x3f800000;
  puVar3[1] = 0x3f800000;
  puVar3[2] = 0x3f800000;
  puVar3[3] = 0x3f800000;
  *(undefined8 *)(puVar3 + 4) = 0;
  *(undefined8 *)(puVar3 + 6) = 0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  *(undefined8 *)(puVar3 + 8) = uVar1;
  iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x38,8);
  local_38.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
           )((ulong)puVar3 | 0x2000000000000);
  pbrt::BSDF::BSDF((BSDF *)CONCAT44(extraout_var_00,iVar2),&(si->super_Interaction).wo,
                   &(si->super_Interaction).n,&(si->shading).n,&(si->shading).dpdu,&local_38);
  return (BSDF *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

BSDF* createLambertian(const SurfaceInteraction& si, Allocator alloc) {
    SampledSpectrum Kd(1.);
    return alloc.new_object<BSDF>(
        si.wo, si.n, si.shading.n, si.shading.dpdu,
        alloc.new_object<DiffuseBxDF>(Kd, SampledSpectrum(0.), 0));
}